

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_rr_divide(DisasContext_conflict14 *ctx)

{
  uint uVar1;
  TCGv_ptr pTVar2;
  TCGContext_conflict9 *pTVar3;
  TCGContext_conflict9 *pTVar4;
  uint uVar5;
  TCGv_i32 pTVar6;
  TCGTemp *pTVar7;
  TCGv_i32 pTVar8;
  TCGv_i32 pTVar9;
  int nargs;
  int32_t arg2;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i32 arg1;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i64 pTVar10;
  uintptr_t o;
  uintptr_t o_3;
  code *pcVar11;
  TCGContext_conflict9 *pTVar12;
  uint uVar13;
  uintptr_t o_4;
  TCGTemp *pTVar14;
  uint uVar15;
  TCGTemp *pTVar16;
  uintptr_t o_12;
  ulong uVar17;
  TCGv_i32 local_78;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  pTVar12 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar17 = (ulong)(uVar1 >> 0x1c);
  uVar13 = uVar1 >> 0xc & 0xf;
  uVar15 = uVar1 >> 8 & 0xf;
  uVar5 = uVar1 >> 0x14 & 0xff;
  if (0x39 < uVar5) {
    if (uVar5 == 0x3a) {
      if ((uVar1 >> 0x1c & 1) != 0) {
        pTVar8 = tcg_const_i32_tricore(pTVar12,2);
        pTVar9 = tcg_const_i32_tricore(pTVar12,3);
        pTVar4 = ctx->uc->tcg_ctx;
        tcg_gen_op2_tricore(pTVar4,INDEX_op_movi_i32,(TCGArg)(pTVar4->cpu_PC + (long)pTVar4),
                            (long)(int)(ctx->base).pc_next);
        local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_50 = (TCGTemp *)(pTVar8 + (long)pTVar12);
        local_48 = (TCGTemp *)(pTVar9 + (long)pTVar12);
        tcg_gen_callN_tricore(pTVar12,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
        (ctx->base).is_jmp = DISAS_NORETURN;
        tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
        tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar9 + (long)pTVar12));
      }
      local_78 = pTVar12->cpu_gpr_d[uVar17];
      pTVar8 = pTVar12->cpu_gpr_d[uVar17 + 1];
      pTVar4 = ctx->uc->tcg_ctx;
      pTVar7 = (TCGTemp *)((long)&pTVar4->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
      pTVar16 = (TCGTemp *)((long)&pTVar4->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
      pTVar14 = tcg_temp_new_internal_tricore(pTVar4,TCG_TYPE_I64,false);
      pTVar10 = (TCGv_i64)((long)pTVar14 - (long)pTVar4);
      local_58 = (TCGTemp *)(pTVar4->cpu_env + (long)pTVar4);
      pTVar12 = pTVar4;
      local_50 = pTVar7;
      local_48 = pTVar16;
      if ((ctx->features & 2) == 0) {
        pcVar11 = helper_dvinit_h_13;
      }
      else {
        pcVar11 = helper_dvinit_h_131;
      }
    }
    else {
      if (uVar5 == 0x4a) {
        pTVar14 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
        pTVar7 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
        local_40 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
        local_38 = (TCGTemp *)((long)local_40 - (long)pTVar12);
        if ((uVar1 >> 0x1c & 1) != 0) {
          pTVar4 = ctx->uc->tcg_ctx;
          pTVar8 = tcg_const_i32_tricore(pTVar4,2);
          pTVar9 = tcg_const_i32_tricore(pTVar4,3);
          pTVar3 = ctx->uc->tcg_ctx;
          tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                              (long)(int)(ctx->base).pc_next);
          local_58 = (TCGTemp *)(pTVar4->cpu_env + (long)pTVar4);
          local_50 = (TCGTemp *)(pTVar8 + (long)pTVar4);
          local_48 = (TCGTemp *)(pTVar9 + (long)pTVar4);
          tcg_gen_callN_tricore(pTVar4,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
          (ctx->base).is_jmp = DISAS_NORETURN;
          tcg_temp_free_internal_tricore(pTVar4,(TCGTemp *)(pTVar8 + (long)pTVar4));
          tcg_temp_free_internal_tricore(pTVar4,(TCGTemp *)(pTVar9 + (long)pTVar4));
        }
        pTVar16 = local_38;
        pTVar8 = (TCGv_i32)((long)pTVar14 - (long)pTVar12);
        pTVar9 = (TCGv_i32)((long)pTVar7 - (long)pTVar12);
        tcg_gen_shri_i32_tricore(pTVar12,(TCGv_i32)local_38,pTVar12->cpu_gpr_d[uVar15],8);
        tcg_gen_op2_tricore(pTVar12,INDEX_op_movi_i32,(TCGArg)(pTVar12->cpu_PSW_AV + (long)pTVar12),
                            0);
        if ((ctx->features & 2) == 0) {
          tcg_gen_abs_i32_tricore(pTVar12,pTVar8,(TCGv_i32)pTVar16);
          tcg_gen_abs_i32_tricore(pTVar12,pTVar9,pTVar12->cpu_gpr_d[uVar13]);
          tcg_gen_setcond_i32_tricore(pTVar12,TCG_COND_GE,pTVar12->cpu_PSW_V,pTVar8,pTVar9);
        }
        else {
          tcg_gen_setcondi_i32_tricore
                    (pTVar12,TCG_COND_EQ,pTVar12->cpu_PSW_V,pTVar12->cpu_gpr_d[uVar13],0);
        }
        tcg_gen_shli_i32_tricore(pTVar12,pTVar12->cpu_PSW_V,pTVar12->cpu_PSW_V,0x1f);
        tcg_gen_op3_tricore(pTVar12,INDEX_op_or_i32,(TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                            (TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                            (TCGArg)(pTVar12->cpu_PSW_V + (long)pTVar12));
        pTVar6 = pTVar12->cpu_gpr_d[uVar17];
        arg1 = pTVar12->cpu_gpr_d[uVar15];
        arg2 = 0x18;
        goto LAB_00d3b176;
      }
      if (uVar5 != 0x5a) goto switchD_00d39ff9_caseD_6;
      if ((uVar1 >> 0x1c & 1) != 0) {
        pTVar8 = tcg_const_i32_tricore(pTVar12,2);
        pTVar9 = tcg_const_i32_tricore(pTVar12,3);
        pTVar4 = ctx->uc->tcg_ctx;
        tcg_gen_op2_tricore(pTVar4,INDEX_op_movi_i32,(TCGArg)(pTVar4->cpu_PC + (long)pTVar4),
                            (long)(int)(ctx->base).pc_next);
        local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_50 = (TCGTemp *)(pTVar8 + (long)pTVar12);
        local_48 = (TCGTemp *)(pTVar9 + (long)pTVar12);
        tcg_gen_callN_tricore(pTVar12,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
        (ctx->base).is_jmp = DISAS_NORETURN;
        tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
        tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar9 + (long)pTVar12));
      }
      local_78 = pTVar12->cpu_gpr_d[uVar17];
      pTVar8 = pTVar12->cpu_gpr_d[uVar17 + 1];
      pTVar4 = ctx->uc->tcg_ctx;
      pTVar7 = (TCGTemp *)((long)&pTVar4->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
      pTVar16 = (TCGTemp *)((long)&pTVar4->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
      pTVar14 = tcg_temp_new_internal_tricore(pTVar4,TCG_TYPE_I64,false);
      pTVar10 = (TCGv_i64)((long)pTVar14 - (long)pTVar4);
      local_58 = (TCGTemp *)(pTVar4->cpu_env + (long)pTVar4);
      pTVar12 = pTVar4;
      local_50 = pTVar7;
      local_48 = pTVar16;
      if ((ctx->features & 2) == 0) {
        pcVar11 = helper_dvinit_b_13;
      }
      else {
        pcVar11 = helper_dvinit_b_131;
      }
    }
    tcg_gen_callN_tricore(pTVar12,pcVar11,pTVar14,3,&local_58);
    tcg_gen_extr_i64_i32_tricore(pTVar12,local_78,pTVar8,pTVar10);
    pTVar14 = (TCGTemp *)(pTVar10 + (long)pTVar12);
    goto LAB_00d3b1c2;
  }
  switch(uVar5) {
  case 0:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    local_48 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_fcmp;
    goto LAB_00d3a8dd;
  case 1:
    local_58 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_bmerge;
    break;
  case 2:
    local_58 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_parity;
    nargs = 1;
    goto LAB_00d3b005;
  case 3:
    if ((ctx->features & 8) == 0) {
LAB_00d3a6a7:
      generate_trap(ctx,2,1);
      return;
    }
    local_58 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_crc32;
    break;
  case 4:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    local_48 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_fmul_tricore;
    goto LAB_00d3a8dd;
  case 5:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    local_48 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar13]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_fdiv_tricore;
LAB_00d3a8dd:
    nargs = 3;
    goto LAB_00d3b005;
  default:
switchD_00d39ff9_caseD_6:
    pTVar8 = tcg_const_i32_tricore(pTVar12,2);
    pTVar9 = tcg_const_i32_tricore(pTVar12,1);
    pTVar4 = ctx->uc->tcg_ctx;
    tcg_gen_op2_tricore(pTVar4,INDEX_op_movi_i32,(TCGArg)(pTVar4->cpu_PC + (long)pTVar4),
                        (long)(int)(ctx->base).pc_next);
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    pTVar14 = (TCGTemp *)(pTVar9 + (long)pTVar12);
    local_50 = (TCGTemp *)(pTVar8 + (long)pTVar12);
    local_48 = pTVar14;
    tcg_gen_callN_tricore(pTVar12,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
    (ctx->base).is_jmp = DISAS_NORETURN;
    tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
    goto LAB_00d3b1c2;
  case 8:
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar8 = tcg_const_i32_tricore(pTVar12,2);
      pTVar9 = tcg_const_i32_tricore(pTVar12,3);
      pTVar4 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar4,INDEX_op_movi_i32,(TCGArg)(pTVar4->cpu_PC + (long)pTVar4),
                          (long)(int)(ctx->base).pc_next);
      local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      local_50 = (TCGTemp *)(pTVar8 + (long)pTVar12);
      local_48 = (TCGTemp *)(pTVar9 + (long)pTVar12);
      tcg_gen_callN_tricore(pTVar12,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
      tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar9 + (long)pTVar12));
    }
    pTVar8 = pTVar12->cpu_gpr_d[uVar17];
    pTVar9 = pTVar12->cpu_gpr_d[uVar17 + 1];
    pTVar4 = ctx->uc->tcg_ctx;
    pTVar6 = pTVar12->cpu_gpr_d[uVar15];
    pTVar14 = tcg_temp_new_internal_tricore(pTVar4,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar14 - (long)pTVar4);
    pcVar11 = helper_unpack;
    pTVar12 = pTVar4;
    local_58 = (TCGTemp *)((long)&pTVar4->pool_cur + (long)pTVar6);
    goto LAB_00d3aa13;
  case 9:
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar8 = tcg_const_i32_tricore(pTVar12,2);
      pTVar9 = tcg_const_i32_tricore(pTVar12,3);
      pTVar4 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar4,INDEX_op_movi_i32,(TCGArg)(pTVar4->cpu_PC + (long)pTVar4),
                          (long)(int)(ctx->base).pc_next);
      local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      local_50 = (TCGTemp *)(pTVar8 + (long)pTVar12);
      local_48 = (TCGTemp *)(pTVar9 + (long)pTVar12);
      tcg_gen_callN_tricore(pTVar12,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
      tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar9 + (long)pTVar12));
    }
    pTVar8 = pTVar12->cpu_gpr_d[uVar17];
    pTVar9 = pTVar12->cpu_gpr_d[uVar17 + 1];
    pTVar4 = ctx->uc->tcg_ctx;
    pTVar6 = pTVar12->cpu_gpr_d[uVar15];
    pTVar14 = tcg_temp_new_internal_tricore(pTVar4,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar14 - (long)pTVar4);
    pcVar11 = helper_bsplit;
    pTVar12 = pTVar4;
    local_58 = (TCGTemp *)((long)&pTVar4->pool_cur + (long)pTVar6);
LAB_00d3aa13:
    tcg_gen_callN_tricore(pTVar12,pcVar11,pTVar14,1,&local_58);
    tcg_gen_extr_i64_i32_tricore(pTVar12,pTVar8,pTVar9,pTVar10);
LAB_00d3b1c2:
    tcg_temp_free_internal_tricore(pTVar12,pTVar14);
    return;
  case 10:
    tcg_gen_setcondi_i32_tricore
              (pTVar12,TCG_COND_EQ,pTVar12->cpu_PSW_V,pTVar12->cpu_gpr_d[uVar13],0);
    tcg_gen_shli_i32_tricore(pTVar12,pTVar12->cpu_PSW_V,pTVar12->cpu_PSW_V,0x1f);
    tcg_gen_op3_tricore(pTVar12,INDEX_op_or_i32,(TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                        (TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                        (TCGArg)(pTVar12->cpu_PSW_V + (long)pTVar12));
    tcg_gen_op2_tricore(pTVar12,INDEX_op_movi_i32,(TCGArg)(pTVar12->cpu_PSW_AV + (long)pTVar12),0);
    if (pTVar12->cpu_gpr_d[uVar17] != pTVar12->cpu_gpr_d[uVar15]) {
      tcg_gen_op2_tricore(pTVar12,INDEX_op_mov_i32,
                          (TCGArg)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]),
                          (TCGArg)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]));
    }
    tcg_gen_op2_tricore(pTVar12,INDEX_op_movi_i32,
                        (TCGArg)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17 + 1]),0)
    ;
    return;
  case 0xc:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pcVar11 = helper_updfl;
    pTVar14 = (TCGTemp *)0x0;
    break;
  case 0x10:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_ftoi;
    break;
  case 0x13:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_ftoiz;
    break;
  case 0x14:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_itof;
    break;
  case 0x16:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_utof;
    break;
  case 0x17:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_ftouz;
    break;
  case 0x19:
    local_58 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]);
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]);
    pcVar11 = helper_qseed;
    break;
  case 0x1a:
    local_38 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_38 - (long)pTVar12);
    pTVar14 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
    pTVar9 = (TCGv_i32)((long)pTVar14 - (long)pTVar12);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar4 = ctx->uc->tcg_ctx;
      pTVar6 = tcg_const_i32_tricore(pTVar4,2);
      local_40 = (TCGTemp *)tcg_const_i32_tricore(pTVar4,3);
      pTVar3 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                          (long)(int)(ctx->base).pc_next);
      local_58 = (TCGTemp *)(pTVar4->cpu_env + (long)pTVar4);
      local_48 = (TCGTemp *)((long)local_40 + (long)pTVar4);
      local_50 = (TCGTemp *)(pTVar6 + (long)pTVar4);
      local_40 = local_48;
      tcg_gen_callN_tricore(pTVar4,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar4,(TCGTemp *)(pTVar6 + (long)pTVar4));
      tcg_temp_free_internal_tricore(pTVar4,local_40);
    }
    tcg_gen_setcondi_i32_tricore(pTVar12,TCG_COND_EQ,pTVar8,pTVar12->cpu_gpr_d[uVar13],-1);
    tcg_gen_setcondi_i32_tricore(pTVar12,TCG_COND_EQ,pTVar9,pTVar12->cpu_gpr_d[uVar15],-0x80000000);
    pTVar7 = local_38;
    tcg_gen_op3_tricore(pTVar12,INDEX_op_and_i32,(TCGArg)local_38,(TCGArg)local_38,(TCGArg)pTVar14);
    tcg_gen_setcondi_i32_tricore(pTVar12,TCG_COND_EQ,pTVar9,pTVar12->cpu_gpr_d[uVar13],0);
    tcg_gen_op3_tricore(pTVar12,INDEX_op_or_i32,(TCGArg)(pTVar12->cpu_PSW_V + (long)pTVar12),
                        (TCGArg)pTVar7,(TCGArg)pTVar14);
    tcg_gen_shli_i32_tricore(pTVar12,pTVar12->cpu_PSW_V,pTVar12->cpu_PSW_V,0x1f);
    tcg_gen_op3_tricore(pTVar12,INDEX_op_or_i32,(TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                        (TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                        (TCGArg)(pTVar12->cpu_PSW_V + (long)pTVar12));
    tcg_gen_op2_tricore(pTVar12,INDEX_op_movi_i32,(TCGArg)(pTVar12->cpu_PSW_AV + (long)pTVar12),0);
    if (pTVar12->cpu_gpr_d[uVar17] != pTVar12->cpu_gpr_d[uVar15]) {
      tcg_gen_op2_tricore(pTVar12,INDEX_op_mov_i32,
                          (TCGArg)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar17]),
                          (TCGArg)((long)&pTVar12->pool_cur + (long)pTVar12->cpu_gpr_d[uVar15]));
    }
    tcg_gen_sari_i32_tricore(pTVar12,pTVar12->cpu_gpr_d[uVar17 + 1],pTVar12->cpu_gpr_d[uVar15],0x1f)
    ;
    tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
    pTVar14 = (TCGTemp *)(pTVar9 + (long)pTVar12);
    goto LAB_00d3b1c2;
  case 0x20:
    if ((ctx->features & 4) == 0) goto LAB_00d3a6a7;
    pTVar14 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar14 - (long)pTVar12);
    pTVar2 = pTVar12->cpu_env;
    pTVar8 = pTVar12->cpu_gpr_d[uVar15];
    pTVar9 = pTVar12->cpu_gpr_d[uVar13];
    pcVar11 = helper_divide;
    goto LAB_00d3a52c;
  case 0x21:
    if ((ctx->features & 4) == 0) goto LAB_00d3a6a7;
    pTVar14 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar14 - (long)pTVar12);
    pTVar2 = pTVar12->cpu_env;
    pTVar8 = pTVar12->cpu_gpr_d[uVar15];
    pTVar9 = pTVar12->cpu_gpr_d[uVar13];
    pcVar11 = helper_divide_u;
LAB_00d3a52c:
    local_48 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar9);
    local_50 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)pTVar8);
    local_58 = (TCGTemp *)(pTVar2 + (long)pTVar12);
    tcg_gen_callN_tricore(pTVar12,pcVar11,pTVar14,3,&local_58);
    tcg_gen_extr_i64_i32_tricore
              (pTVar12,pTVar12->cpu_gpr_d[uVar17],pTVar12->cpu_gpr_d[uVar17 + 1],pTVar10);
    goto LAB_00d3b1c2;
  case 0x2a:
    pTVar14 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
    pTVar7 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
    local_40 = tcg_temp_new_internal_tricore(pTVar12,TCG_TYPE_I32,false);
    local_38 = (TCGTemp *)((long)local_40 - (long)pTVar12);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar4 = ctx->uc->tcg_ctx;
      pTVar8 = tcg_const_i32_tricore(pTVar4,2);
      pTVar9 = tcg_const_i32_tricore(pTVar4,3);
      pTVar3 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                          (long)(int)(ctx->base).pc_next);
      local_58 = (TCGTemp *)(pTVar4->cpu_env + (long)pTVar4);
      local_50 = (TCGTemp *)(pTVar8 + (long)pTVar4);
      local_48 = (TCGTemp *)(pTVar9 + (long)pTVar4);
      tcg_gen_callN_tricore(pTVar4,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_58);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar4,(TCGTemp *)(pTVar8 + (long)pTVar4));
      tcg_temp_free_internal_tricore(pTVar4,(TCGTemp *)(pTVar9 + (long)pTVar4));
    }
    pTVar16 = local_38;
    pTVar8 = (TCGv_i32)((long)pTVar14 - (long)pTVar12);
    pTVar9 = (TCGv_i32)((long)pTVar7 - (long)pTVar12);
    tcg_gen_shri_i32_tricore(pTVar12,(TCGv_i32)local_38,pTVar12->cpu_gpr_d[uVar15],0x10);
    tcg_gen_op2_tricore(pTVar12,INDEX_op_movi_i32,(TCGArg)(pTVar12->cpu_PSW_AV + (long)pTVar12),0);
    if ((ctx->features & 2) == 0) {
      tcg_gen_abs_i32_tricore(pTVar12,pTVar8,(TCGv_i32)pTVar16);
      tcg_gen_abs_i32_tricore(pTVar12,pTVar9,pTVar12->cpu_gpr_d[uVar13]);
      tcg_gen_setcond_i32_tricore(pTVar12,TCG_COND_GE,pTVar12->cpu_PSW_V,pTVar8,pTVar9);
    }
    else {
      tcg_gen_setcondi_i32_tricore
                (pTVar12,TCG_COND_EQ,pTVar12->cpu_PSW_V,pTVar12->cpu_gpr_d[uVar13],0);
    }
    tcg_gen_shli_i32_tricore(pTVar12,pTVar12->cpu_PSW_V,pTVar12->cpu_PSW_V,0x1f);
    tcg_gen_op3_tricore(pTVar12,INDEX_op_or_i32,(TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                        (TCGArg)(pTVar12->cpu_PSW_SV + (long)pTVar12),
                        (TCGArg)(pTVar12->cpu_PSW_V + (long)pTVar12));
    pTVar6 = pTVar12->cpu_gpr_d[uVar17];
    arg1 = pTVar12->cpu_gpr_d[uVar15];
    arg2 = 0x10;
LAB_00d3b176:
    tcg_gen_shli_i32_tricore(pTVar12,pTVar6,arg1,arg2);
    if ((TCGTemp *)pTVar12->cpu_gpr_d[uVar17 + 1] != pTVar16) {
      tcg_gen_op2_tricore(pTVar12,INDEX_op_mov_i32,
                          (TCGArg)((long)&pTVar12->pool_cur +
                                  (long)&((TCGTemp *)pTVar12->cpu_gpr_d[uVar17 + 1])->field_0x0),
                          (TCGArg)local_40);
    }
    tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar8 + (long)pTVar12));
    tcg_temp_free_internal_tricore(pTVar12,(TCGTemp *)(pTVar9 + (long)pTVar12));
    pTVar14 = (TCGTemp *)((long)&pTVar12->pool_cur + (long)&pTVar16->field_0x0);
    goto LAB_00d3b1c2;
  }
  nargs = 2;
LAB_00d3b005:
  tcg_gen_callN_tricore(pTVar12,pcVar11,pTVar14,nargs,&local_58);
  return;
}

Assistant:

static void decode_rr_divide(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1, r2, r3;

    TCGv temp, temp2, temp3;

    op2 = MASK_OP_RR_OP2(ctx->opcode);
    r3 = MASK_OP_RR_D(ctx->opcode);
    r2 = MASK_OP_RR_S2(ctx->opcode);
    r1 = MASK_OP_RR_S1(ctx->opcode);

    switch (op2) {
    case OPC2_32_RR_BMERGE:
        gen_helper_bmerge(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_BSPLIT:
        CHECK_REG_PAIR(r3);
        gen_bsplit(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_DVINIT_B:
        CHECK_REG_PAIR(r3);
        gen_dvinit_b(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1],
                     tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_DVINIT_BU:
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        temp3 = tcg_temp_new(tcg_ctx);
        CHECK_REG_PAIR(r3);
        tcg_gen_shri_tl(tcg_ctx, temp3, tcg_ctx->cpu_gpr_d[r1], 8);
        /* reset av */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        if (!has_feature(ctx, TRICORE_FEATURE_131)) {
            /* overflow = (abs(D[r3+1]) >= abs(D[r2])) */
            tcg_gen_abs_tl(tcg_ctx, temp, temp3);
            tcg_gen_abs_tl(tcg_ctx, temp2, tcg_ctx->cpu_gpr_d[r2]);
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->cpu_PSW_V, temp, temp2);
        } else {
            /* overflow = (D[b] == 0) */
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_gpr_d[r2], 0);
        }
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* write result */
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], 24);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], temp3);

        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
        tcg_temp_free(tcg_ctx, temp3);
        break;
    case OPC2_32_RR_DVINIT_H:
        CHECK_REG_PAIR(r3);
        gen_dvinit_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1],
                     tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_DVINIT_HU:
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        temp3 = tcg_temp_new(tcg_ctx);
        CHECK_REG_PAIR(r3);
        tcg_gen_shri_tl(tcg_ctx, temp3, tcg_ctx->cpu_gpr_d[r1], 16);
        /* reset av */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        if (!has_feature(ctx, TRICORE_FEATURE_131)) {
            /* overflow = (abs(D[r3+1]) >= abs(D[r2])) */
            tcg_gen_abs_tl(tcg_ctx, temp, temp3);
            tcg_gen_abs_tl(tcg_ctx, temp2, tcg_ctx->cpu_gpr_d[r2]);
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->cpu_PSW_V, temp, temp2);
        } else {
            /* overflow = (D[b] == 0) */
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_gpr_d[r2], 0);
        }
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* write result */
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], 16);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], temp3);
        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
        tcg_temp_free(tcg_ctx, temp3);
        break;
    case OPC2_32_RR_DVINIT:
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        CHECK_REG_PAIR(r3);
        /* overflow = ((D[b] == 0) ||
                      ((D[b] == 0xFFFFFFFF) && (D[a] == 0x80000000))) */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp, tcg_ctx->cpu_gpr_d[r2], 0xffffffff);
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, tcg_ctx->cpu_gpr_d[r1], 0x80000000);
        tcg_gen_and_tl(tcg_ctx, temp, temp, temp2);
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, tcg_ctx->cpu_gpr_d[r2], 0);
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, temp, temp2);
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* reset av */
       tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        /* write result */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1]);
        /* sign extend to high reg */
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1], 31);
        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
        break;
    case OPC2_32_RR_DVINIT_U:
        /* overflow = (D[b] == 0) */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_gpr_d[r2], 0);
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* reset av */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        /* write result */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1]);
        /* zero extend to high reg*/
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], 0);
        break;
    case OPC2_32_RR_PARITY:
        gen_helper_parity(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_UNPACK:
        CHECK_REG_PAIR(r3);
        gen_unpack(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_CRC32:
        if (has_feature(ctx, TRICORE_FEATURE_161)) {
            gen_helper_crc32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        } else {
            generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
        }
        break;
    case OPC2_32_RR_DIV:
        if (has_feature(ctx, TRICORE_FEATURE_16)) {
            GEN_HELPER_RR(tcg_ctx, divide, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1],
                          tcg_ctx->cpu_gpr_d[r2]);
        } else {
            generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
        }
        break;
    case OPC2_32_RR_DIV_U:
        if (has_feature(ctx, TRICORE_FEATURE_16)) {
            GEN_HELPER_RR(tcg_ctx, divide_u, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1],
                          tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        } else {
            generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
        }
        break;
    case OPC2_32_RR_MUL_F:
        gen_helper_fmul(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_DIV_F:
        gen_helper_fdiv(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_CMP_F:
        gen_helper_fcmp(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_FTOI:
        gen_helper_ftoi(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_ITOF:
        gen_helper_itof(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_FTOUZ:
        gen_helper_ftouz(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_UPDFL:
        gen_helper_updfl(tcg_ctx, tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_UTOF:
        gen_helper_utof(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_FTOIZ:
        gen_helper_ftoiz(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_QSEED_F:
        gen_helper_qseed(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
}